

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void * __thiscall tetgenmesh::memorypool::traverse(memorypool *this)

{
  void **ppvVar1;
  int iVar2;
  void *pvVar3;
  
  pvVar3 = this->pathitem;
  if (pvVar3 == this->nextitem) {
    pvVar3 = (void *)0x0;
  }
  else {
    iVar2 = this->pathitemsleft;
    if (iVar2 == 0) {
      ppvVar1 = (void **)*this->pathblock;
      this->pathblock = ppvVar1;
      pvVar3 = (void *)((long)ppvVar1 +
                       (((long)this->alignbytes + 8U) -
                       (ulong)(ppvVar1 + 1) % (ulong)(long)this->alignbytes));
      iVar2 = this->itemsperblock;
    }
    this->pathitem = (void *)((long)this->itembytes + (long)pvVar3);
    this->pathitemsleft = iVar2 + -1;
  }
  return pvVar3;
}

Assistant:

void* tetgenmesh::memorypool::traverse()
{
  void *newitem;
  uintptr_t alignptr;

  // Stop upon exhausting the list of items.
  if (pathitem == nextitem) {
    return (void *) NULL;
  }
  // Check whether any untraversed items remain in the current block.
  if (pathitemsleft == 0) {
    // Find the next block.
    pathblock = (void **) *pathblock;
    // Find the first item in the block.  Increment by the size of (void *).
    alignptr = (uintptr_t) (pathblock + 1);
    // Align with item on an `alignbytes'-byte boundary.
    pathitem = (void *)
      (alignptr + (uintptr_t) alignbytes -
       (alignptr % (uintptr_t) alignbytes));
    // Set the number of items left in the current block.
    pathitemsleft = itemsperblock;
  }
  newitem = pathitem;
  // Find the next item in the block.
  pathitem = (void *) ((uintptr_t) pathitem + itembytes);
  pathitemsleft--;
  return newitem;
}